

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1c1499d::AV1ConvolveParametersTest_GetLowbdTestParams_Test::TestBody
          (AV1ConvolveParametersTest_GetLowbdTestParams_Test *this)

{
  size_type sVar1;
  _func_void_uchar_ptr_int_uchar_ptr_int_int_int_InterpFilterParams_ptr_int_ConvolveParams_ptr
  *in_RDX;
  pointer *__ptr;
  SEARCH_METHODS *pSVar2;
  char *in_R9;
  pointer pTVar3;
  bool bVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  v;
  AssertHelper local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  undefined8 *local_78;
  string local_70;
  AssertHelper local_50;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  local_48;
  
  (anonymous_namespace)::
  GetLowbdTestParams<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,int,ConvolveParams*)>
            (&local_48,(_anonymous_namespace_ *)av1_convolve_x_sr_c,in_RDX);
  pTVar3 = local_48.
           super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88.data_._0_4_ = 0x1b;
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)local_48.
               super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_48.
               super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_70,"27U","v.size()",(uint *)&local_88,(unsigned_long *)&local_80);
  sVar1 = local_70._M_string_length;
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = *(SEARCH_METHODS **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_test.cc"
               ,0x8a,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
LAB_006bd134:
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
LAB_006bd151:
    if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_70._M_string_length !=
          (undefined8 *)(local_70._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_70._M_string_length);
      }
      operator_delete((void *)local_70._M_string_length);
    }
  }
  else {
    if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_70._M_string_length !=
          (undefined8 *)(local_70._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_70._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    if (pTVar3 != local_48.
                  super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_80._M_head_impl._0_4_ = 8;
        local_88.data_._0_4_ = pTVar3->bd_;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_70,"8","p.BitDepth()",(int *)&local_80,(int *)&local_88);
        sVar1 = local_70._M_string_length;
        if ((char)local_70._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
            pSVar2 = "";
          }
          else {
            pSVar2 = *(SEARCH_METHODS **)local_70._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_test.cc"
                     ,0x8c,(char *)pSVar2);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
          goto LAB_006bd134;
        }
        if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_70._M_string_length !=
              (undefined8 *)(local_70._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_70._M_string_length);
          }
          operator_delete((void *)sVar1);
        }
        bVar4 = pTVar3->test_func_ == av1_convolve_x_sr_c;
        local_80._M_head_impl._0_1_ = bVar4;
        local_78 = (undefined8 *)0x0;
        if (!bVar4) {
          testing::Message::Message((Message *)&local_88);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_70,(internal *)&local_80,(AssertionResult *)"same_fn","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_test.cc"
                     ,0x91,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                            (char)local_70._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p
                                    ));
          }
          local_70._M_string_length = (size_type)local_78;
          if ((long *)CONCAT44(local_88.data_._4_4_,(int)local_88.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_88.data_._4_4_,(int)local_88.data_) + 8))();
            local_70._M_string_length = (size_type)local_78;
          }
          goto LAB_006bd151;
        }
        pTVar3 = pTVar3 + 1;
      } while (pTVar3 != local_48.
                         super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if (local_48.
      super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(AV1ConvolveParametersTest, GetLowbdTestParams) {
  auto v = GetLowbdTestParams(av1_convolve_x_sr_c);
  ASSERT_EQ(27U, v.size());
  for (const auto &p : v) {
    ASSERT_EQ(8, p.BitDepth());
    // Needed (instead of ASSERT_EQ(...) since gtest does not
    // have built in printing for arbitrary functions, which
    // causes a compilation error.
    bool same_fn = av1_convolve_x_sr_c == p.TestFunction();
    ASSERT_TRUE(same_fn);
  }
}